

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> __thiscall
google::protobuf::internal::ExtensionSet::Insert(ExtensionSet *this,int key)

{
  int *__src;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar1;
  KeyValue *pKVar2;
  ushort uVar3;
  ushort uVar4;
  size_t __n;
  size_t extraout_RDX;
  uint uVar5;
  ulong uVar6;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar7;
  
  uVar3 = this->flat_size_;
  if ((short)uVar3 < 0) {
LAB_001f2d3d:
    pVar7 = InternalInsertIntoLargeMap(this,key);
  }
  else {
    pKVar2 = (this->map_).flat;
    uVar4 = uVar3;
    if (uVar3 == 0) {
      uVar6 = 0;
    }
    else {
      do {
        uVar5 = (uint)uVar4;
        if (pKVar2[(ulong)uVar4 - 1].first == key) {
          pVar1._8_8_ = 0;
          pVar1.first = &pKVar2[(ulong)uVar4 - 1].second;
          return pVar1;
        }
        if (pKVar2[(ulong)uVar4 - 1].first < key) goto LAB_001f2ca5;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
      uVar5 = 0;
LAB_001f2ca5:
      uVar6 = (ulong)(uVar5 << 5);
    }
    if (uVar3 == this->flat_capacity_) {
      GrowCapacity(this,(ulong)uVar3 + 1);
      uVar3 = this->flat_size_;
      if ((short)uVar3 < 0) goto LAB_001f2d3d;
      pKVar2 = (this->map_).flat;
    }
    __src = (int *)((long)(&(pKVar2->second).cached_size + -5) + uVar6);
    __n = (ulong)uVar3 * 0x20 - uVar6;
    if (__n != 0) {
      memmove((void *)((long)pKVar2 + ((ulong)uVar3 * 0x20 - __n) + 0x20),__src,__n);
      uVar3 = this->flat_size_;
      __n = extraout_RDX;
    }
    this->flat_size_ = uVar3 + 1;
    *__src = key;
    __src[2] = 0;
    __src[3] = 0;
    __src[4] = 0;
    __src[5] = 0;
    __src[6] = 0;
    __src[7] = 0;
    pVar7._9_7_ = (int7)(__n >> 8);
    pVar7.second = true;
    pVar7.first = (Extension *)(__src + 2);
  }
  return pVar7;
}

Assistant:

std::pair<ExtensionSet::Extension*, bool> ExtensionSet::Insert(int key) {
  if (ABSL_PREDICT_FALSE(is_large())) {
    return InternalInsertIntoLargeMap(key);
  }
  uint16_t i = flat_size_;
  KeyValue* flat = map_.flat;
  // Iterating from the back to benefit the case where the keys are inserted in
  // increasing order.
  for (; i > 0; --i) {
    int map_key = flat[i - 1].first;
    if (map_key == key) {
      return {&flat[i - 1].second, false};
    }
    if (map_key < key) {
      break;
    }
  }
  if (flat_size_ == flat_capacity_) {
    GrowCapacity(flat_size_ + 1);
    if (ABSL_PREDICT_FALSE(is_large())) {
      return InternalInsertIntoLargeMap(key);
    }
    flat = map_.flat;  // Reload flat pointer after GrowCapacity.
  }

  std::copy_backward(flat + i, flat + flat_size_, flat + flat_size_ + 1);
  ++flat_size_;
  flat[i].first = key;
  flat[i].second = Extension();
  return {&flat[i].second, true};
}